

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void printInfo(char *fileName)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ostream *poVar5;
  double *pdVar6;
  float *pfVar7;
  int *piVar8;
  Matrix33<float> *pMVar9;
  Matrix44<float> *pMVar10;
  PreviewImage *pPVar11;
  string *psVar12;
  reference pbVar13;
  long lVar14;
  Rational *this;
  uint *puVar15;
  TimeCode *pTVar16;
  char *pcVar17;
  char *in_RDI;
  double dVar18;
  V3fAttribute *ta_22;
  V3iAttribute *ta_21;
  V2fAttribute *ta_20;
  V2iAttribute *ta_19;
  TimeCodeAttribute *ta_18;
  TileDescriptionAttribute *ta_17;
  RationalAttribute *ta_16;
  const_iterator i_2;
  StringVectorAttribute *ta_15;
  StringAttribute *ta_14;
  PreviewImageAttribute *ta_13;
  M44fAttribute *ta_12;
  M33fAttribute *ta_11;
  LineOrderAttribute *ta_10;
  KeyCodeAttribute *ta_9;
  IntAttribute *ta_8;
  FloatAttribute *ta_7;
  EnvmapAttribute *ta_6;
  DoubleAttribute *ta_5;
  CompressionAttribute *ta_4;
  ChromaticitiesAttribute *ta_3;
  ChannelListAttribute *ta_2;
  Box2fAttribute *ta_1;
  Box2iAttribute *ta;
  Attribute *a;
  ConstIterator i_1;
  Header *h;
  int p;
  int i;
  bool fileComplete;
  int parts;
  MultiPartInputFile in;
  Vec3<float> *in_stack_fffffffffffff6d8;
  ostream *in_stack_fffffffffffff6e0;
  long local_918;
  ostream *in_stack_fffffffffffff700;
  long local_8f8;
  Attribute *in_stack_fffffffffffff710;
  long local_8d8;
  long local_8b8;
  long local_8a0;
  ostream *in_stack_fffffffffffff780;
  long local_848;
  long local_7e8;
  long local_7b8;
  long local_790;
  long local_740;
  long local_5b0;
  long local_4c8;
  long local_4b0;
  long local_3c8;
  long local_3a8;
  long local_388;
  long local_370;
  long local_350;
  long local_338;
  long local_2d0;
  long local_2b8;
  long local_280;
  long local_248;
  byte local_159;
  TimeCode local_120 [8];
  long local_118;
  long local_110;
  long local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_100;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  Attribute *local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  byte local_3d;
  int local_2c;
  MultiPartInputFile local_28 [32];
  char *local_8;
  
  local_8 = in_RDI;
  iVar3 = Imf_3_4::globalThreadCount();
  Imf_3_4::MultiPartInputFile::MultiPartInputFile(local_28,in_RDI,iVar3,true);
  local_2c = Imf_3_4::MultiPartInputFile::parts();
  local_3d = 1;
  local_44 = 0;
  while( true ) {
    local_159 = 0;
    if (local_44 < local_2c) {
      local_159 = local_3d;
    }
    if ((local_159 & 1) == 0) break;
    bVar1 = Imf_3_4::MultiPartInputFile::partComplete((int)local_28);
    if ((bVar1 & 1) == 0) {
      local_3d = 0;
    }
    local_44 = local_44 + 1;
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"\nfile ");
  poVar5 = std::operator<<(poVar5,local_8);
  pcVar17 = " (incomplete)";
  if ((local_3d & 1) != 0) {
    pcVar17 = "";
  }
  poVar5 = std::operator<<(poVar5,pcVar17);
  std::operator<<(poVar5,":\n\n");
  poVar5 = std::operator<<((ostream *)&std::cout,"file format version: ");
  iVar3 = Imf_3_4::MultiPartInputFile::version();
  iVar3 = Imf_3_4::getVersion(iVar3);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
  poVar5 = std::operator<<(poVar5,", flags 0x");
  local_48 = (int)std::setbase(0x10);
  poVar5 = std::operator<<(poVar5,(_Setbase)local_48);
  iVar3 = Imf_3_4::MultiPartInputFile::version();
  iVar3 = Imf_3_4::getFlags(iVar3);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
  local_4c = (int)std::setbase(10);
  poVar5 = std::operator<<(poVar5,(_Setbase)local_4c);
  std::operator<<(poVar5,"\n");
  for (local_50 = 0; local_50 < local_2c; local_50 = local_50 + 1) {
    local_58 = Imf_3_4::MultiPartInputFile::header((int)local_28);
    if (local_2c != 1) {
      poVar5 = std::operator<<((ostream *)&std::cout,"\n\n part ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_50);
      bVar1 = Imf_3_4::MultiPartInputFile::partComplete((int)local_28);
      pcVar17 = " (incomplete)";
      if ((bVar1 & 1) != 0) {
        pcVar17 = "";
      }
      poVar5 = std::operator<<(poVar5,pcVar17);
      std::operator<<(poVar5,":\n");
    }
    local_60 = Imf_3_4::Header::begin();
    while( true ) {
      local_68 = Imf_3_4::Header::end();
      bVar2 = Imf_3_4::operator!=((ConstIterator *)in_stack_fffffffffffff6e0,
                                  (ConstIterator *)in_stack_fffffffffffff6d8);
      if (!bVar2) break;
      local_70 = Imf_3_4::Header::ConstIterator::attribute((ConstIterator *)0x105282);
      pcVar17 = Imf_3_4::Header::ConstIterator::name((ConstIterator *)0x1052a9);
      poVar5 = std::operator<<((ostream *)&std::cout,pcVar17);
      poVar5 = std::operator<<(poVar5," (type ");
      pcVar17 = (char *)(**(code **)(*(long *)local_70 + 0x10))();
      poVar5 = std::operator<<(poVar5,pcVar17);
      std::operator<<(poVar5,")");
      if (local_70 == (Attribute *)0x0) {
        local_248 = 0;
      }
      else {
        local_248 = __dynamic_cast(local_70,&Imf_3_4::Attribute::typeinfo,
                                   &Imf_3_4::TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>>>::
                                    typeinfo,0);
      }
      local_78 = local_248;
      if (local_248 == 0) {
        if (local_70 == (Attribute *)0x0) {
          local_280 = 0;
        }
        else {
          local_280 = __dynamic_cast(local_70,&Imf_3_4::Attribute::typeinfo,
                                     &Imf_3_4::
                                      TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<float>>>::
                                      typeinfo,0);
        }
        local_80 = local_280;
        if (local_280 == 0) {
          if (local_70 == (Attribute *)0x0) {
            local_2b8 = 0;
          }
          else {
            local_2b8 = __dynamic_cast(local_70,&Imf_3_4::Attribute::typeinfo,
                                       &Imf_3_4::TypedAttribute<Imf_3_4::ChannelList>::typeinfo,0);
          }
          local_88 = local_2b8;
          if (local_2b8 == 0) {
            if (local_70 == (Attribute *)0x0) {
              local_2d0 = 0;
            }
            else {
              local_2d0 = __dynamic_cast(local_70,&Imf_3_4::Attribute::typeinfo,
                                         &Imf_3_4::TypedAttribute<Imf_3_4::Chromaticities>::typeinfo
                                         ,0);
            }
            local_90 = local_2d0;
            if (local_2d0 == 0) {
              if (local_70 == (Attribute *)0x0) {
                local_338 = 0;
              }
              else {
                local_338 = __dynamic_cast(local_70,&Imf_3_4::Attribute::typeinfo,
                                           &Imf_3_4::TypedAttribute<Imf_3_4::Compression>::typeinfo,
                                           0);
              }
              local_98 = local_338;
              if (local_338 == 0) {
                if (local_70 == (Attribute *)0x0) {
                  local_350 = 0;
                }
                else {
                  local_350 = __dynamic_cast(local_70,&Imf_3_4::Attribute::typeinfo,
                                             &Imf_3_4::TypedAttribute<double>::typeinfo,0);
                }
                local_a0 = local_350;
                if (local_350 == 0) {
                  if (local_70 == (Attribute *)0x0) {
                    local_370 = 0;
                  }
                  else {
                    local_370 = __dynamic_cast(local_70,&Imf_3_4::Attribute::typeinfo,
                                               &Imf_3_4::TypedAttribute<Imf_3_4::Envmap>::typeinfo,0
                                              );
                  }
                  local_a8 = local_370;
                  if (local_370 == 0) {
                    if (local_70 == (Attribute *)0x0) {
                      local_388 = 0;
                    }
                    else {
                      local_388 = __dynamic_cast(local_70,&Imf_3_4::Attribute::typeinfo,
                                                 &Imf_3_4::TypedAttribute<float>::typeinfo,0);
                    }
                    local_b0 = local_388;
                    if (local_388 == 0) {
                      if (local_70 == (Attribute *)0x0) {
                        local_3a8 = 0;
                      }
                      else {
                        local_3a8 = __dynamic_cast(local_70,&Imf_3_4::Attribute::typeinfo,
                                                   &Imf_3_4::TypedAttribute<int>::typeinfo,0);
                      }
                      local_b8 = local_3a8;
                      if (local_3a8 == 0) {
                        if (local_70 == (Attribute *)0x0) {
                          local_3c8 = 0;
                        }
                        else {
                          local_3c8 = __dynamic_cast(local_70,&Imf_3_4::Attribute::typeinfo,
                                                     &Imf_3_4::TypedAttribute<Imf_3_4::KeyCode>::
                                                      typeinfo,0);
                        }
                        local_c0 = local_3c8;
                        if (local_3c8 == 0) {
                          if (local_70 == (Attribute *)0x0) {
                            local_4b0 = 0;
                          }
                          else {
                            local_4b0 = __dynamic_cast(local_70,&Imf_3_4::Attribute::typeinfo,
                                                       &Imf_3_4::TypedAttribute<Imf_3_4::LineOrder>
                                                        ::typeinfo,0);
                          }
                          local_c8 = local_4b0;
                          if (local_4b0 == 0) {
                            if (local_70 == (Attribute *)0x0) {
                              local_4c8 = 0;
                            }
                            else {
                              local_4c8 = __dynamic_cast(local_70,&Imf_3_4::Attribute::typeinfo,
                                                         &Imf_3_4::
                                                  TypedAttribute<Imath_3_2::Matrix33<float>>::
                                                  typeinfo,0);
                            }
                            local_d0 = local_4c8;
                            if (local_4c8 == 0) {
                              if (local_70 == (Attribute *)0x0) {
                                local_5b0 = 0;
                              }
                              else {
                                local_5b0 = __dynamic_cast(local_70,&Imf_3_4::Attribute::typeinfo,
                                                           &Imf_3_4::
                                                  TypedAttribute<Imath_3_2::Matrix44<float>>::
                                                  typeinfo,0);
                              }
                              local_d8 = local_5b0;
                              if (local_5b0 == 0) {
                                if (local_70 == (Attribute *)0x0) {
                                  local_740 = 0;
                                }
                                else {
                                  local_740 = __dynamic_cast(local_70,&Imf_3_4::Attribute::typeinfo,
                                                             &Imf_3_4::
                                                  TypedAttribute<Imf_3_4::PreviewImage>::typeinfo,0)
                                  ;
                                }
                                local_e0 = local_740;
                                if (local_740 == 0) {
                                  if (local_70 == (Attribute *)0x0) {
                                    local_790 = 0;
                                  }
                                  else {
                                    local_790 = __dynamic_cast(local_70,&Imf_3_4::Attribute::
                                                                         typeinfo,
                                                               &Imf_3_4::
                                                  TypedAttribute<std::__cxx11::string>::typeinfo,0);
                                  }
                                  local_e8 = local_790;
                                  if (local_790 == 0) {
                                    if (local_70 == (Attribute *)0x0) {
                                      local_7b8 = 0;
                                    }
                                    else {
                                      local_7b8 = __dynamic_cast(local_70,&Imf_3_4::Attribute::
                                                                           typeinfo,
                                                                 &Imf_3_4::
                                                  TypedAttribute<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                                                  ::typeinfo,0);
                                    }
                                    local_f0 = local_7b8;
                                    if (local_7b8 == 0) {
                                      if (local_70 == (Attribute *)0x0) {
                                        local_7e8 = 0;
                                      }
                                      else {
                                        local_7e8 = __dynamic_cast(local_70,&Imf_3_4::Attribute::
                                                                             typeinfo,
                                                                   &Imf_3_4::
                                                  TypedAttribute<Imf_3_4::Rational>::typeinfo,0);
                                      }
                                      local_108 = local_7e8;
                                      if (local_7e8 == 0) {
                                        if (local_70 == (Attribute *)0x0) {
                                          local_848 = 0;
                                        }
                                        else {
                                          local_848 = __dynamic_cast(local_70,&Imf_3_4::Attribute::
                                                                               typeinfo,
                                                                     &Imf_3_4::
                                                  TypedAttribute<Imf_3_4::TileDescription>::typeinfo
                                                  ,0);
                                        }
                                        local_110 = local_848;
                                        if (local_848 == 0) {
                                          if (local_70 == (Attribute *)0x0) {
                                            local_8a0 = 0;
                                          }
                                          else {
                                            local_8a0 = __dynamic_cast(local_70,&Imf_3_4::Attribute
                                                                                 ::typeinfo,
                                                                       &Imf_3_4::
                                                  TypedAttribute<Imf_3_4::TimeCode>::typeinfo,0);
                                          }
                                          local_118 = local_8a0;
                                          if (local_8a0 == 0) {
                                            if (local_70 == (Attribute *)0x0) {
                                              local_8b8 = 0;
                                            }
                                            else {
                                              local_8b8 = __dynamic_cast(local_70,&Imf_3_4::
                                                  Attribute::typeinfo,
                                                  &Imf_3_4::TypedAttribute<Imath_3_2::Vec2<int>>::
                                                   typeinfo,0);
                                            }
                                            if (local_8b8 == 0) {
                                              if (local_70 == (Attribute *)0x0) {
                                                local_8d8 = 0;
                                              }
                                              else {
                                                local_8d8 = __dynamic_cast(local_70,&Imf_3_4::
                                                  Attribute::typeinfo,
                                                  &Imf_3_4::TypedAttribute<Imath_3_2::Vec2<float>>::
                                                   typeinfo,0);
                                              }
                                              if (local_8d8 == 0) {
                                                in_stack_fffffffffffff710 = local_70;
                                                if (local_70 == (Attribute *)0x0) {
                                                  local_8f8 = 0;
                                                }
                                                else {
                                                  local_8f8 = __dynamic_cast(local_70,&Imf_3_4::
                                                  Attribute::typeinfo,
                                                  &Imf_3_4::TypedAttribute<Imath_3_2::Vec3<int>>::
                                                   typeinfo,0);
                                                }
                                                if (local_8f8 == 0) {
                                                  if (local_70 == (Attribute *)0x0) {
                                                    local_918 = 0;
                                                  }
                                                  else {
                                                    local_918 = __dynamic_cast(local_70,&Imf_3_4::
                                                  Attribute::typeinfo,
                                                  &Imf_3_4::TypedAttribute<Imath_3_2::Vec3<float>>::
                                                   typeinfo,0);
                                                  }
                                                  if (local_918 != 0) {
                                                    in_stack_fffffffffffff6e0 =
                                                         std::operator<<((ostream *)&std::cout,": ")
                                                    ;
                                                    in_stack_fffffffffffff6d8 =
                                                         (Vec3<float> *)
                                                         Imf_3_4::
                                                  TypedAttribute<Imath_3_2::Vec3<float>>::value();
                                                  Imath_3_2::operator<<
                                                            (in_stack_fffffffffffff6e0,
                                                             in_stack_fffffffffffff6d8);
                                                  }
                                                }
                                                else {
                                                  in_stack_fffffffffffff700 =
                                                       std::operator<<((ostream *)&std::cout,": ");
                                                  Imf_3_4::TypedAttribute<Imath_3_2::Vec3<int>>::
                                                  value();
                                                  Imath_3_2::operator<<
                                                            (in_stack_fffffffffffff6e0,
                                                             (Vec3<int> *)in_stack_fffffffffffff6d8)
                                                  ;
                                                }
                                              }
                                              else {
                                                std::operator<<((ostream *)&std::cout,": ");
                                                Imf_3_4::TypedAttribute<Imath_3_2::Vec2<float>>::
                                                value();
                                                Imath_3_2::operator<<
                                                          (in_stack_fffffffffffff6e0,
                                                           (Vec2<float> *)in_stack_fffffffffffff6d8)
                                                ;
                                              }
                                            }
                                            else {
                                              std::operator<<((ostream *)&std::cout,": ");
                                              Imf_3_4::TypedAttribute<Imath_3_2::Vec2<int>>::value()
                                              ;
                                              Imath_3_2::operator<<
                                                        (in_stack_fffffffffffff6e0,
                                                         (Vec2<int> *)in_stack_fffffffffffff6d8);
                                            }
                                          }
                                          else {
                                            std::operator<<((ostream *)&std::cout,":\n");
                                            pTVar16 = (TimeCode *)
                                                      Imf_3_4::TypedAttribute<Imf_3_4::TimeCode>::
                                                      value();
                                            Imf_3_4::TimeCode::TimeCode(local_120,pTVar16);
                                            printTimeCode((TimeCode *)in_stack_fffffffffffff780);
                                          }
                                        }
                                        else {
                                          std::operator<<((ostream *)&std::cout,":\n    ");
                                          Imf_3_4::TypedAttribute<Imf_3_4::TileDescription>::value()
                                          ;
                                          printLevelMode(ONE_LEVEL);
                                          poVar5 = std::operator<<((ostream *)&std::cout,
                                                                   "\n    tile size ");
                                          puVar15 = (uint *)Imf_3_4::
                                                  TypedAttribute<Imf_3_4::TileDescription>::value();
                                          poVar5 = (ostream *)
                                                   std::ostream::operator<<(poVar5,*puVar15);
                                          poVar5 = std::operator<<(poVar5," by ");
                                          lVar14 = Imf_3_4::TypedAttribute<Imf_3_4::TileDescription>
                                                   ::value();
                                          in_stack_fffffffffffff780 =
                                               (ostream *)
                                               std::ostream::operator<<
                                                         (poVar5,*(uint *)(lVar14 + 4));
                                          std::operator<<(in_stack_fffffffffffff780," pixels");
                                          lVar14 = Imf_3_4::TypedAttribute<Imf_3_4::TileDescription>
                                                   ::value();
                                          if (*(int *)(lVar14 + 8) != 0) {
                                            std::operator<<((ostream *)&std::cout,
                                                            "\n    level sizes rounded ");
                                            Imf_3_4::TypedAttribute<Imf_3_4::TileDescription>::value
                                                      ();
                                            printLevelRoundingMode(ROUND_DOWN);
                                          }
                                        }
                                      }
                                      else {
                                        poVar5 = std::operator<<((ostream *)&std::cout,": ");
                                        piVar8 = (int *)Imf_3_4::TypedAttribute<Imf_3_4::Rational>::
                                                        value();
                                        poVar5 = (ostream *)std::ostream::operator<<(poVar5,*piVar8)
                                        ;
                                        poVar5 = std::operator<<(poVar5,"/");
                                        lVar14 = Imf_3_4::TypedAttribute<Imf_3_4::Rational>::value()
                                        ;
                                        poVar5 = (ostream *)
                                                 std::ostream::operator<<
                                                           (poVar5,*(uint *)(lVar14 + 4));
                                        poVar5 = std::operator<<(poVar5," (");
                                        this = (Rational *)
                                               Imf_3_4::TypedAttribute<Imf_3_4::Rational>::value();
                                        dVar18 = Imf_3_4::Rational::operator_cast_to_double(this);
                                        poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar18);
                                        std::operator<<(poVar5,")");
                                      }
                                    }
                                    else {
                                      std::operator<<((ostream *)&std::cout,":");
                                      Imf_3_4::
                                      TypedAttribute<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                                      ::value();
                                      local_f8._M_current =
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)std::
                                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ::begin((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)in_stack_fffffffffffff6d8);
                                      while( true ) {
                                        Imf_3_4::
                                        TypedAttribute<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                                        ::value();
                                        local_100 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::end((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)in_stack_fffffffffffff6d8);
                                        bVar2 = __gnu_cxx::operator!=
                                                          ((
                                                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)in_stack_fffffffffffff6e0,
                                                  (
                                                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)in_stack_fffffffffffff6d8);
                                        if (!bVar2) break;
                                        poVar5 = std::operator<<((ostream *)&std::cout,"\n    \"");
                                        pbVar13 = __gnu_cxx::
                                                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ::operator*(&local_f8);
                                        poVar5 = std::operator<<(poVar5,(string *)pbVar13);
                                        std::operator<<(poVar5,"\"");
                                        __gnu_cxx::
                                        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        ::operator++(&local_f8);
                                      }
                                    }
                                  }
                                  else {
                                    poVar5 = std::operator<<((ostream *)&std::cout,": \"");
                                    psVar12 = (string *)
                                              Imf_3_4::TypedAttribute<std::__cxx11::string>::value()
                                    ;
                                    poVar5 = std::operator<<(poVar5,psVar12);
                                    std::operator<<(poVar5,"\"");
                                  }
                                }
                                else {
                                  poVar5 = std::operator<<((ostream *)&std::cout,": ");
                                  pPVar11 = (PreviewImage *)
                                            Imf_3_4::TypedAttribute<Imf_3_4::PreviewImage>::value();
                                  uVar4 = Imf_3_4::PreviewImage::width(pPVar11);
                                  poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar4);
                                  poVar5 = std::operator<<(poVar5," by ");
                                  pPVar11 = (PreviewImage *)
                                            Imf_3_4::TypedAttribute<Imf_3_4::PreviewImage>::value();
                                  uVar4 = Imf_3_4::PreviewImage::height(pPVar11);
                                  poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar4);
                                  std::operator<<(poVar5," pixels");
                                }
                              }
                              else {
                                poVar5 = std::operator<<((ostream *)&std::cout,":\n   (");
                                pMVar10 = (Matrix44<float> *)
                                          Imf_3_4::TypedAttribute<Imath_3_2::Matrix44<float>>::value
                                                    ();
                                pfVar7 = Imath_3_2::Matrix44<float>::operator[](pMVar10,0);
                                poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pfVar7);
                                poVar5 = std::operator<<(poVar5," ");
                                pMVar10 = (Matrix44<float> *)
                                          Imf_3_4::TypedAttribute<Imath_3_2::Matrix44<float>>::value
                                                    ();
                                pfVar7 = Imath_3_2::Matrix44<float>::operator[](pMVar10,0);
                                poVar5 = (ostream *)std::ostream::operator<<(poVar5,pfVar7[1]);
                                poVar5 = std::operator<<(poVar5," ");
                                pMVar10 = (Matrix44<float> *)
                                          Imf_3_4::TypedAttribute<Imath_3_2::Matrix44<float>>::value
                                                    ();
                                pfVar7 = Imath_3_2::Matrix44<float>::operator[](pMVar10,0);
                                poVar5 = (ostream *)std::ostream::operator<<(poVar5,pfVar7[2]);
                                poVar5 = std::operator<<(poVar5," ");
                                pMVar10 = (Matrix44<float> *)
                                          Imf_3_4::TypedAttribute<Imath_3_2::Matrix44<float>>::value
                                                    ();
                                pfVar7 = Imath_3_2::Matrix44<float>::operator[](pMVar10,0);
                                poVar5 = (ostream *)std::ostream::operator<<(poVar5,pfVar7[3]);
                                poVar5 = std::operator<<(poVar5,"\n    ");
                                pMVar10 = (Matrix44<float> *)
                                          Imf_3_4::TypedAttribute<Imath_3_2::Matrix44<float>>::value
                                                    ();
                                pfVar7 = Imath_3_2::Matrix44<float>::operator[](pMVar10,1);
                                poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pfVar7);
                                poVar5 = std::operator<<(poVar5," ");
                                pMVar10 = (Matrix44<float> *)
                                          Imf_3_4::TypedAttribute<Imath_3_2::Matrix44<float>>::value
                                                    ();
                                pfVar7 = Imath_3_2::Matrix44<float>::operator[](pMVar10,1);
                                poVar5 = (ostream *)std::ostream::operator<<(poVar5,pfVar7[1]);
                                poVar5 = std::operator<<(poVar5," ");
                                pMVar10 = (Matrix44<float> *)
                                          Imf_3_4::TypedAttribute<Imath_3_2::Matrix44<float>>::value
                                                    ();
                                pfVar7 = Imath_3_2::Matrix44<float>::operator[](pMVar10,1);
                                poVar5 = (ostream *)std::ostream::operator<<(poVar5,pfVar7[2]);
                                poVar5 = std::operator<<(poVar5," ");
                                pMVar10 = (Matrix44<float> *)
                                          Imf_3_4::TypedAttribute<Imath_3_2::Matrix44<float>>::value
                                                    ();
                                pfVar7 = Imath_3_2::Matrix44<float>::operator[](pMVar10,1);
                                poVar5 = (ostream *)std::ostream::operator<<(poVar5,pfVar7[3]);
                                poVar5 = std::operator<<(poVar5,"\n    ");
                                pMVar10 = (Matrix44<float> *)
                                          Imf_3_4::TypedAttribute<Imath_3_2::Matrix44<float>>::value
                                                    ();
                                pfVar7 = Imath_3_2::Matrix44<float>::operator[](pMVar10,2);
                                poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pfVar7);
                                poVar5 = std::operator<<(poVar5," ");
                                pMVar10 = (Matrix44<float> *)
                                          Imf_3_4::TypedAttribute<Imath_3_2::Matrix44<float>>::value
                                                    ();
                                pfVar7 = Imath_3_2::Matrix44<float>::operator[](pMVar10,2);
                                poVar5 = (ostream *)std::ostream::operator<<(poVar5,pfVar7[1]);
                                poVar5 = std::operator<<(poVar5," ");
                                pMVar10 = (Matrix44<float> *)
                                          Imf_3_4::TypedAttribute<Imath_3_2::Matrix44<float>>::value
                                                    ();
                                pfVar7 = Imath_3_2::Matrix44<float>::operator[](pMVar10,2);
                                poVar5 = (ostream *)std::ostream::operator<<(poVar5,pfVar7[2]);
                                poVar5 = std::operator<<(poVar5," ");
                                pMVar10 = (Matrix44<float> *)
                                          Imf_3_4::TypedAttribute<Imath_3_2::Matrix44<float>>::value
                                                    ();
                                pfVar7 = Imath_3_2::Matrix44<float>::operator[](pMVar10,2);
                                poVar5 = (ostream *)std::ostream::operator<<(poVar5,pfVar7[3]);
                                poVar5 = std::operator<<(poVar5,"\n    ");
                                pMVar10 = (Matrix44<float> *)
                                          Imf_3_4::TypedAttribute<Imath_3_2::Matrix44<float>>::value
                                                    ();
                                pfVar7 = Imath_3_2::Matrix44<float>::operator[](pMVar10,3);
                                poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pfVar7);
                                poVar5 = std::operator<<(poVar5," ");
                                pMVar10 = (Matrix44<float> *)
                                          Imf_3_4::TypedAttribute<Imath_3_2::Matrix44<float>>::value
                                                    ();
                                pfVar7 = Imath_3_2::Matrix44<float>::operator[](pMVar10,3);
                                poVar5 = (ostream *)std::ostream::operator<<(poVar5,pfVar7[1]);
                                poVar5 = std::operator<<(poVar5," ");
                                pMVar10 = (Matrix44<float> *)
                                          Imf_3_4::TypedAttribute<Imath_3_2::Matrix44<float>>::value
                                                    ();
                                pfVar7 = Imath_3_2::Matrix44<float>::operator[](pMVar10,3);
                                poVar5 = (ostream *)std::ostream::operator<<(poVar5,pfVar7[2]);
                                poVar5 = std::operator<<(poVar5," ");
                                pMVar10 = (Matrix44<float> *)
                                          Imf_3_4::TypedAttribute<Imath_3_2::Matrix44<float>>::value
                                                    ();
                                pfVar7 = Imath_3_2::Matrix44<float>::operator[](pMVar10,3);
                                poVar5 = (ostream *)std::ostream::operator<<(poVar5,pfVar7[3]);
                                std::operator<<(poVar5,")");
                              }
                            }
                            else {
                              poVar5 = std::operator<<((ostream *)&std::cout,":\n   (");
                              pMVar9 = (Matrix33<float> *)
                                       Imf_3_4::TypedAttribute<Imath_3_2::Matrix33<float>>::value();
                              pfVar7 = Imath_3_2::Matrix33<float>::operator[](pMVar9,0);
                              poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pfVar7);
                              poVar5 = std::operator<<(poVar5," ");
                              pMVar9 = (Matrix33<float> *)
                                       Imf_3_4::TypedAttribute<Imath_3_2::Matrix33<float>>::value();
                              pfVar7 = Imath_3_2::Matrix33<float>::operator[](pMVar9,0);
                              poVar5 = (ostream *)std::ostream::operator<<(poVar5,pfVar7[1]);
                              poVar5 = std::operator<<(poVar5," ");
                              pMVar9 = (Matrix33<float> *)
                                       Imf_3_4::TypedAttribute<Imath_3_2::Matrix33<float>>::value();
                              pfVar7 = Imath_3_2::Matrix33<float>::operator[](pMVar9,0);
                              poVar5 = (ostream *)std::ostream::operator<<(poVar5,pfVar7[2]);
                              poVar5 = std::operator<<(poVar5,"\n    ");
                              pMVar9 = (Matrix33<float> *)
                                       Imf_3_4::TypedAttribute<Imath_3_2::Matrix33<float>>::value();
                              pfVar7 = Imath_3_2::Matrix33<float>::operator[](pMVar9,1);
                              poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pfVar7);
                              poVar5 = std::operator<<(poVar5," ");
                              pMVar9 = (Matrix33<float> *)
                                       Imf_3_4::TypedAttribute<Imath_3_2::Matrix33<float>>::value();
                              pfVar7 = Imath_3_2::Matrix33<float>::operator[](pMVar9,1);
                              poVar5 = (ostream *)std::ostream::operator<<(poVar5,pfVar7[1]);
                              poVar5 = std::operator<<(poVar5," ");
                              pMVar9 = (Matrix33<float> *)
                                       Imf_3_4::TypedAttribute<Imath_3_2::Matrix33<float>>::value();
                              pfVar7 = Imath_3_2::Matrix33<float>::operator[](pMVar9,1);
                              poVar5 = (ostream *)std::ostream::operator<<(poVar5,pfVar7[2]);
                              poVar5 = std::operator<<(poVar5,"\n    ");
                              pMVar9 = (Matrix33<float> *)
                                       Imf_3_4::TypedAttribute<Imath_3_2::Matrix33<float>>::value();
                              pfVar7 = Imath_3_2::Matrix33<float>::operator[](pMVar9,2);
                              poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pfVar7);
                              poVar5 = std::operator<<(poVar5," ");
                              pMVar9 = (Matrix33<float> *)
                                       Imf_3_4::TypedAttribute<Imath_3_2::Matrix33<float>>::value();
                              pfVar7 = Imath_3_2::Matrix33<float>::operator[](pMVar9,2);
                              poVar5 = (ostream *)std::ostream::operator<<(poVar5,pfVar7[1]);
                              poVar5 = std::operator<<(poVar5," ");
                              pMVar9 = (Matrix33<float> *)
                                       Imf_3_4::TypedAttribute<Imath_3_2::Matrix33<float>>::value();
                              pfVar7 = Imath_3_2::Matrix33<float>::operator[](pMVar9,2);
                              poVar5 = (ostream *)std::ostream::operator<<(poVar5,pfVar7[2]);
                              std::operator<<(poVar5,")");
                            }
                          }
                          else {
                            std::operator<<((ostream *)&std::cout,": ");
                            Imf_3_4::TypedAttribute<Imf_3_4::LineOrder>::value();
                            printLineOrder(INCREASING_Y);
                          }
                        }
                        else {
                          poVar5 = std::operator<<((ostream *)&std::cout,
                                                   ":\n    film manufacturer code ");
                          Imf_3_4::TypedAttribute<Imf_3_4::KeyCode>::value();
                          iVar3 = Imf_3_4::KeyCode::filmMfcCode();
                          poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
                          poVar5 = std::operator<<(poVar5,"\n    film type code ");
                          Imf_3_4::TypedAttribute<Imf_3_4::KeyCode>::value();
                          iVar3 = Imf_3_4::KeyCode::filmType();
                          poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
                          poVar5 = std::operator<<(poVar5,"\n    prefix ");
                          Imf_3_4::TypedAttribute<Imf_3_4::KeyCode>::value();
                          iVar3 = Imf_3_4::KeyCode::prefix();
                          poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
                          poVar5 = std::operator<<(poVar5,"\n    count ");
                          Imf_3_4::TypedAttribute<Imf_3_4::KeyCode>::value();
                          iVar3 = Imf_3_4::KeyCode::count();
                          poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
                          poVar5 = std::operator<<(poVar5,"\n    perf offset ");
                          Imf_3_4::TypedAttribute<Imf_3_4::KeyCode>::value();
                          iVar3 = Imf_3_4::KeyCode::perfOffset();
                          poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
                          poVar5 = std::operator<<(poVar5,"\n    perfs per frame ");
                          Imf_3_4::TypedAttribute<Imf_3_4::KeyCode>::value();
                          iVar3 = Imf_3_4::KeyCode::perfsPerFrame();
                          poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
                          poVar5 = std::operator<<(poVar5,"\n    perfs per count ");
                          Imf_3_4::TypedAttribute<Imf_3_4::KeyCode>::value();
                          iVar3 = Imf_3_4::KeyCode::perfsPerCount();
                          std::ostream::operator<<(poVar5,iVar3);
                        }
                      }
                      else {
                        poVar5 = std::operator<<((ostream *)&std::cout,": ");
                        piVar8 = (int *)Imf_3_4::TypedAttribute<int>::value();
                        std::ostream::operator<<(poVar5,*piVar8);
                      }
                    }
                    else {
                      poVar5 = std::operator<<((ostream *)&std::cout,": ");
                      pfVar7 = (float *)Imf_3_4::TypedAttribute<float>::value();
                      std::ostream::operator<<(poVar5,*pfVar7);
                    }
                  }
                  else {
                    std::operator<<((ostream *)&std::cout,": ");
                    Imf_3_4::TypedAttribute<Imf_3_4::Envmap>::value();
                    printEnvmap((Envmap *)in_stack_fffffffffffff6e0);
                  }
                }
                else {
                  poVar5 = std::operator<<((ostream *)&std::cout,": ");
                  pdVar6 = (double *)Imf_3_4::TypedAttribute<double>::value();
                  std::ostream::operator<<(poVar5,*pdVar6);
                }
              }
              else {
                std::operator<<((ostream *)&std::cout,": ");
                Imf_3_4::TypedAttribute<Imf_3_4::Compression>::value();
                printCompression((Compression)((ulong)in_stack_fffffffffffff710 >> 0x20));
              }
            }
            else {
              std::operator<<((ostream *)&std::cout,":\n    red   ");
              Imf_3_4::TypedAttribute<Imf_3_4::Chromaticities>::value();
              poVar5 = Imath_3_2::operator<<
                                 (in_stack_fffffffffffff6e0,(Vec2<float> *)in_stack_fffffffffffff6d8
                                 );
              std::operator<<(poVar5,"\n    green ");
              Imf_3_4::TypedAttribute<Imf_3_4::Chromaticities>::value();
              poVar5 = Imath_3_2::operator<<
                                 (in_stack_fffffffffffff6e0,(Vec2<float> *)in_stack_fffffffffffff6d8
                                 );
              std::operator<<(poVar5,"\n    blue  ");
              Imf_3_4::TypedAttribute<Imf_3_4::Chromaticities>::value();
              poVar5 = Imath_3_2::operator<<
                                 (in_stack_fffffffffffff6e0,(Vec2<float> *)in_stack_fffffffffffff6d8
                                 );
              std::operator<<(poVar5,"\n    white ");
              Imf_3_4::TypedAttribute<Imf_3_4::Chromaticities>::value();
              Imath_3_2::operator<<
                        (in_stack_fffffffffffff6e0,(Vec2<float> *)in_stack_fffffffffffff6d8);
            }
          }
          else {
            std::operator<<((ostream *)&std::cout,":");
            Imf_3_4::TypedAttribute<Imf_3_4::ChannelList>::value();
            printChannelList((ChannelList *)in_stack_fffffffffffff700);
          }
        }
        else {
          std::operator<<((ostream *)&std::cout,": ");
          Imf_3_4::TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<float>>>::value();
          poVar5 = Imath_3_2::operator<<
                             (in_stack_fffffffffffff6e0,(Vec2<float> *)in_stack_fffffffffffff6d8);
          std::operator<<(poVar5," - ");
          Imf_3_4::TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<float>>>::value();
          Imath_3_2::operator<<(in_stack_fffffffffffff6e0,(Vec2<float> *)in_stack_fffffffffffff6d8);
        }
      }
      else {
        std::operator<<((ostream *)&std::cout,": ");
        Imf_3_4::TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>>>::value();
        poVar5 = Imath_3_2::operator<<
                           (in_stack_fffffffffffff6e0,(Vec2<int> *)in_stack_fffffffffffff6d8);
        std::operator<<(poVar5," - ");
        Imf_3_4::TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>>>::value();
        Imath_3_2::operator<<(in_stack_fffffffffffff6e0,(Vec2<int> *)in_stack_fffffffffffff6d8);
      }
      std::operator<<((ostream *)&std::cout,'\n');
      Imf_3_4::Header::ConstIterator::operator++((ConstIterator *)in_stack_fffffffffffff6e0);
    }
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  Imf_3_4::MultiPartInputFile::~MultiPartInputFile((MultiPartInputFile *)in_stack_fffffffffffff6e0);
  return;
}

Assistant:

void
printInfo (const char fileName[])
{
    MultiPartInputFile in (fileName);
    int                parts = in.parts ();

    //
    // Check to see if any parts are incomplete
    //

    bool fileComplete = true;

    for (int i = 0; i < parts && fileComplete; ++i)
        if (!in.partComplete (i)) fileComplete = false;

    //
    // Print file name and file format version
    //

    cout << "\nfile " << fileName << (fileComplete ? "" : " (incomplete)")
         << ":\n\n";

    cout << "file format version: " << getVersion (in.version ())
         << ", "
            "flags 0x"
         << setbase (16) << getFlags (in.version ()) << setbase (10) << "\n";

    //
    // Print the header of every part in the file
    //

    for (int p = 0; p < parts; ++p)
    {
        const Header& h = in.header (p);

        if (parts != 1)
        {
            cout << "\n\n part " << p
                 << (in.partComplete (p) ? "" : " (incomplete)") << ":\n";
        }

        for (Header::ConstIterator i = h.begin (); i != h.end (); ++i)
        {
            const Attribute* a = &i.attribute ();
            cout << i.name () << " (type " << a->typeName () << ")";

            if (const Box2iAttribute* ta =
                    dynamic_cast<const Box2iAttribute*> (a))
            {
                cout << ": " << ta->value ().min << " - " << ta->value ().max;
            }

            else if (
                const Box2fAttribute* ta =
                    dynamic_cast<const Box2fAttribute*> (a))
            {
                cout << ": " << ta->value ().min << " - " << ta->value ().max;
            }
            else if (
                const ChannelListAttribute* ta =
                    dynamic_cast<const ChannelListAttribute*> (a))
            {
                cout << ":";
                printChannelList (ta->value ());
            }
            else if (
                const ChromaticitiesAttribute* ta =
                    dynamic_cast<const ChromaticitiesAttribute*> (a))
            {
                cout << ":\n"
                        "    red   "
                     << ta->value ().red
                     << "\n"
                        "    green "
                     << ta->value ().green
                     << "\n"
                        "    blue  "
                     << ta->value ().blue
                     << "\n"
                        "    white "
                     << ta->value ().white;
            }
            else if (
                const CompressionAttribute* ta =
                    dynamic_cast<const CompressionAttribute*> (a))
            {
                cout << ": ";
                printCompression (ta->value ());
            }
            else if (
                const DoubleAttribute* ta =
                    dynamic_cast<const DoubleAttribute*> (a))
            {
                cout << ": " << ta->value ();
            }
            else if (
                const EnvmapAttribute* ta =
                    dynamic_cast<const EnvmapAttribute*> (a))
            {
                cout << ": ";
                printEnvmap (ta->value ());
            }
            else if (
                const FloatAttribute* ta =
                    dynamic_cast<const FloatAttribute*> (a))
            {
                cout << ": " << ta->value ();
            }
            else if (
                const IntAttribute* ta = dynamic_cast<const IntAttribute*> (a))
            {
                cout << ": " << ta->value ();
            }
            else if (
                const KeyCodeAttribute* ta =
                    dynamic_cast<const KeyCodeAttribute*> (a))
            {
                cout << ":\n"
                        "    film manufacturer code "
                     << ta->value ().filmMfcCode ()
                     << "\n"
                        "    film type code "
                     << ta->value ().filmType ()
                     << "\n"
                        "    prefix "
                     << ta->value ().prefix ()
                     << "\n"
                        "    count "
                     << ta->value ().count ()
                     << "\n"
                        "    perf offset "
                     << ta->value ().perfOffset ()
                     << "\n"
                        "    perfs per frame "
                     << ta->value ().perfsPerFrame ()
                     << "\n"
                        "    perfs per count "
                     << ta->value ().perfsPerCount ();
            }
            else if (
                const LineOrderAttribute* ta =
                    dynamic_cast<const LineOrderAttribute*> (a))
            {
                cout << ": ";
                printLineOrder (ta->value ());
            }
            else if (
                const M33fAttribute* ta =
                    dynamic_cast<const M33fAttribute*> (a))
            {
                cout << ":\n"
                        "   ("
                     << ta->value ()[0][0] << " " << ta->value ()[0][1] << " "
                     << ta->value ()[0][2] << "\n    " << ta->value ()[1][0]
                     << " " << ta->value ()[1][1] << " " << ta->value ()[1][2]
                     << "\n    " << ta->value ()[2][0] << " "
                     << ta->value ()[2][1] << " " << ta->value ()[2][2] << ")";
            }
            else if (
                const M44fAttribute* ta =
                    dynamic_cast<const M44fAttribute*> (a))
            {
                cout << ":\n"
                        "   ("
                     << ta->value ()[0][0] << " " << ta->value ()[0][1] << " "
                     << ta->value ()[0][2] << " " << ta->value ()[0][3]
                     << "\n    " << ta->value ()[1][0] << " "
                     << ta->value ()[1][1] << " " << ta->value ()[1][2] << " "
                     << ta->value ()[1][3] << "\n    " << ta->value ()[2][0]
                     << " " << ta->value ()[2][1] << " " << ta->value ()[2][2]
                     << " " << ta->value ()[2][3] << "\n    "
                     << ta->value ()[3][0] << " " << ta->value ()[3][1] << " "
                     << ta->value ()[3][2] << " " << ta->value ()[3][3] << ")";
            }
            else if (
                const PreviewImageAttribute* ta =
                    dynamic_cast<const PreviewImageAttribute*> (a))
            {
                cout << ": " << ta->value ().width () << " by "
                     << ta->value ().height () << " pixels";
            }
            else if (
                const StringAttribute* ta =
                    dynamic_cast<const StringAttribute*> (a))
            {
                cout << ": \"" << ta->value () << "\"";
            }
            else if (
                const StringVectorAttribute* ta =
                    dynamic_cast<const StringVectorAttribute*> (a))
            {
                cout << ":";

                for (StringVector::const_iterator i = ta->value ().begin ();
                     i != ta->value ().end ();
                     ++i)
                {
                    cout << "\n    \"" << *i << "\"";
                }
            }
            else if (
                const RationalAttribute* ta =
                    dynamic_cast<const RationalAttribute*> (a))
            {
                cout << ": " << ta->value ().n << "/" << ta->value ().d << " ("
                     << double (ta->value ()) << ")";
            }
            else if (
                const TileDescriptionAttribute* ta =
                    dynamic_cast<const TileDescriptionAttribute*> (a))
            {
                cout << ":\n    ";

                printLevelMode (ta->value ().mode);

                cout << "\n    tile size " << ta->value ().xSize << " by "
                     << ta->value ().ySize << " pixels";

                if (ta->value ().mode != ONE_LEVEL)
                {
                    cout << "\n    level sizes rounded ";
                    printLevelRoundingMode (ta->value ().roundingMode);
                }
            }
            else if (
                const TimeCodeAttribute* ta =
                    dynamic_cast<const TimeCodeAttribute*> (a))
            {
                cout << ":\n";
                printTimeCode (ta->value ());
            }
            else if (
                const V2iAttribute* ta = dynamic_cast<const V2iAttribute*> (a))
            {
                cout << ": " << ta->value ();
            }
            else if (
                const V2fAttribute* ta = dynamic_cast<const V2fAttribute*> (a))
            {
                cout << ": " << ta->value ();
            }
            else if (
                const V3iAttribute* ta = dynamic_cast<const V3iAttribute*> (a))
            {
                cout << ": " << ta->value ();
            }
            else if (
                const V3fAttribute* ta = dynamic_cast<const V3fAttribute*> (a))
            {
                cout << ": " << ta->value ();
            }

            cout << '\n';
        }
    }

    cout << endl;
}